

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode parse_proxy_auth(SessionHandle *data,connectdata *conn)

{
  CURLcode CVar1;
  char *pcVar2;
  char proxypasswd [256];
  char proxyuser [256];
  char acStack_218 [255];
  undefined1 local_119;
  char local_118 [255];
  undefined1 local_19;
  
  memset(local_118,0,0x100);
  memset(acStack_218,0,0x100);
  pcVar2 = (data->set).str[0x1f];
  if (pcVar2 != (char *)0x0) {
    strncpy(local_118,pcVar2,0x100);
    local_19 = 0;
  }
  pcVar2 = (data->set).str[0x20];
  if (pcVar2 != (char *)0x0) {
    strncpy(acStack_218,pcVar2,0x100);
    local_119 = 0;
  }
  pcVar2 = curl_easy_unescape(data,local_118,0,(int *)0x0);
  conn->proxyuser = pcVar2;
  if (pcVar2 == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar2 = curl_easy_unescape(data,acStack_218,0,(int *)0x0);
    conn->proxypasswd = pcVar2;
    CVar1 = CURLE_OUT_OF_MEMORY;
    if (pcVar2 != (char *)0x0) {
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode parse_proxy_auth(struct SessionHandle *data,
                                 struct connectdata *conn)
{
  char proxyuser[MAX_CURL_USER_LENGTH]="";
  char proxypasswd[MAX_CURL_PASSWORD_LENGTH]="";

  if(data->set.str[STRING_PROXYUSERNAME] != NULL) {
    strncpy(proxyuser, data->set.str[STRING_PROXYUSERNAME],
            MAX_CURL_USER_LENGTH);
    proxyuser[MAX_CURL_USER_LENGTH-1] = '\0';   /*To be on safe side*/
  }
  if(data->set.str[STRING_PROXYPASSWORD] != NULL) {
    strncpy(proxypasswd, data->set.str[STRING_PROXYPASSWORD],
            MAX_CURL_PASSWORD_LENGTH);
    proxypasswd[MAX_CURL_PASSWORD_LENGTH-1] = '\0'; /*To be on safe side*/
  }

  conn->proxyuser = curl_easy_unescape(data, proxyuser, 0, NULL);
  if(!conn->proxyuser)
    return CURLE_OUT_OF_MEMORY;

  conn->proxypasswd = curl_easy_unescape(data, proxypasswd, 0, NULL);
  if(!conn->proxypasswd)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}